

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O3

void check_dtd_chain(DLword type)

{
  uint uVar1;
  uint uVar2;
  undefined6 in_register_0000003a;
  char *cp;
  
  uVar1 = *(uint *)((long)DTDspace +
                   (CONCAT62(in_register_0000003a,type) & 0xffffffff) * 4 +
                   (ulong)(uint)((int)CONCAT62(in_register_0000003a,type) << 5) + 8);
  uVar2 = uVar1 & 0xfffffff;
  if (uVar2 != 0) {
    cp = "Free pointer is ODD!";
    do {
      if ((uVar1 & 1) != 0) {
LAB_00134ac1:
        error(cp);
        return;
      }
      if ((uVar1 >> 0x1b & 1) != 0) {
        error("impossibly-big free pointer!");
      }
      if ((*(ushort *)((ulong)(uVar2 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != type) {
        cp = "BAD cell in next dtdfree ";
        goto LAB_00134ac1;
      }
      uVar1 = *(uint *)(Lisp_world + uVar2);
      uVar2 = uVar1 & 0xfffffff;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void check_dtd_chain(DLword type)
{
  LispPTR next, onext;

  onext = 0;
  next = ((struct dtd *)GetDTD(type))->dtd_free;
  next &= POINTERMASK;

  while (next != NIL) {
    if (next & 1) {
      error("Free pointer is ODD!");
      return;
    }

    if (next & 0x8000000) error("impossibly-big free pointer!");

    if (type != GetTypeNumber(next)) {
      error("BAD cell in next dtdfree ");
      return;
    }
    onext = next;
    next = *((LispPTR *)NativeAligned4FromLAddr(next));
    next &= POINTERMASK;
  }
}